

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O2

void test_save_and_load_with_inifile<int>(int userValue,QString *filepath)

{
  Format local_ac;
  SimpleConfig<int> config2;
  SimpleConfig<int> config1;
  
  SimpleConfig<int>::SimpleConfig(&config1);
  config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig._0_4_ = 1;
  config1.value = userValue;
  MBaseConfig::save((MBaseConfig *)&config1,filepath,(Format *)&config2);
  SimpleConfig<int>::SimpleConfig(&config2);
  local_ac = IniFormat;
  MBaseConfig::load((MBaseConfig *)&config2,filepath,&local_ac);
  QTest::qCompare(config1.value,config2.value,"config1.value","config2.value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
                  ,0x6f);
  MConfig::~MConfig(&config2.super_MConfig);
  MConfig::~MConfig(&config1.super_MConfig);
  return;
}

Assistant:

void test_save_and_load_with_inifile(T userValue, const QString& filepath)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save(filepath);
    SimpleConfig<T> config2;
    config2.load(filepath);
    QCOMPARE(config1.value, config2.value);
}